

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O0

RK_S32 check_ref_cpb_pos(EncVirtualCpb *cpb,EncFrmStatus *frm)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  EncFrmStatus *pEVar4;
  EncFrmStatus *cpb_ref_1;
  EncFrmStatus *cpb_ref;
  RK_S32 cpb_idx;
  RK_S32 pos;
  RK_S32 found;
  RK_S32 seq_idx;
  EncFrmStatus *frm_local;
  EncVirtualCpb *cpb_local;
  
  uVar2 = (uint)(ushort)(frm->val >> 0x30);
  bVar1 = false;
  if (((frm->val & 1) == 0) || ((frm->val >> 6 & 1) != 0)) {
    if ((enc_refs_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","frm %d is not valid ref frm\n","check_ref_cpb_pos",(ulong)uVar2);
    }
    cpb_local._4_4_ = 0xffffffff;
  }
  else {
    if ((frm->val >> 7 & 1) == 0) {
      for (cpb_ref._4_4_ = 0; (int)cpb_ref._4_4_ < 0x10; cpb_ref._4_4_ = cpb_ref._4_4_ + 1) {
        pEVar4 = cpb->cpb_refs + (int)cpb_ref._4_4_;
        if ((enc_refs_debug & 2) != 0) {
          _mpp_log_l(4,"mpp_enc_refs","matching ref %d at pos %d %d\n","check_ref_cpb_pos",
                     (ulong)uVar2,(ulong)cpb_ref._4_4_,(uint)(ushort)(pEVar4->val >> 0x30));
        }
        if (((pEVar4->val & 1) != 0) && ((ushort)(pEVar4->val >> 0x30) == uVar2)) {
          if ((enc_refs_debug & 2) != 0) {
            _mpp_log_l(4,"mpp_enc_refs","found ref %d at pos %d\n","check_ref_cpb_pos",(ulong)uVar2,
                       (ulong)cpb_ref._4_4_);
          }
          bVar1 = true;
          break;
        }
      }
    }
    else {
      for (cpb_ref._4_4_ = 0; (int)cpb_ref._4_4_ < 0x10; cpb_ref._4_4_ = cpb_ref._4_4_ + 1) {
        uVar3 = cpb_ref._4_4_ + 0x10;
        if (((cpb->cpb_refs[(int)uVar3].val & 1) != 0) &&
           (((uint)(cpb->cpb_refs[(int)uVar3].val >> 8) & 0xf) == ((uint)(frm->val >> 8) & 0xf))) {
          if ((enc_refs_debug & 2) != 0) {
            _mpp_log_l(4,"mpp_enc_refs","found ltr ref %d at pos %d\n","check_ref_cpb_pos",
                       (ulong)uVar2,(ulong)uVar3);
          }
          bVar1 = true;
          cpb_ref._4_4_ = uVar3;
          break;
        }
      }
    }
    if (!bVar1) {
      _mpp_log_l(2,"mpp_enc_refs","frm %d can NOT be found in st refs!!\n","check_ref_cpb_pos",
                 (ulong)uVar2);
      cpb_ref._4_4_ = 0xffffffff;
      _dump_cpb(cpb,"check_ref_cpb_pos",0x1be);
    }
    cpb_local._4_4_ = cpb_ref._4_4_;
  }
  return cpb_local._4_4_;
}

Assistant:

static RK_S32 check_ref_cpb_pos(EncVirtualCpb *cpb, EncFrmStatus *frm)
{
    RK_S32 seq_idx = frm->seq_idx;
    RK_S32 found = 0;
    RK_S32 pos = -1;

    if (!frm->valid || frm->is_non_ref) {
        enc_refs_dbg_flow("frm %d is not valid ref frm\n", seq_idx);
        return pos;
    }

    if (frm->is_lt_ref) {
        /* find same lt_idx */
        for (pos = 0; pos < MAX_CPB_LT_FRM; pos++) {
            RK_S32 cpb_idx = pos + MAX_CPB_ST_FRM;
            EncFrmStatus *cpb_ref = &cpb->cpb_refs[cpb_idx];

            if (cpb_ref->valid && cpb_ref->lt_idx == frm->lt_idx) {
                pos = cpb_idx;
                enc_refs_dbg_flow("found ltr ref %d at pos %d\n", seq_idx, pos);
                found = 1;
                break;
            }
        }
    } else {
        /* search seq_idx in cpb to check the st cpb size */
        for (pos = 0; pos < MAX_CPB_ST_FRM; pos++) {
            EncFrmStatus *cpb_ref = &cpb->cpb_refs[pos];

            enc_refs_dbg_flow("matching ref %d at pos %d %d\n",
                              seq_idx, pos, cpb_ref->seq_idx);

            if (cpb_ref->valid && cpb_ref->seq_idx == seq_idx) {
                enc_refs_dbg_flow("found ref %d at pos %d\n", seq_idx, pos);
                found = 1;
                break;
            }
        }
    }

    if (!found) {
        mpp_err_f("frm %d can NOT be found in st refs!!\n", seq_idx);
        pos = -1;
        dump_cpb(cpb);
    }

    return pos;
}